

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_tonumber(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  TRef TVar4;
  TValue tmp;
  TValue TStack_28;
  
  uVar1 = *J->base;
  uVar3 = J->base[1];
  if (((uVar3 & 0x1f000000) != 0 && uVar1 != 0) &&
     ((TVar4 = lj_opt_narrow_toint(J,uVar3), (short)TVar4 < 0 ||
      ((J->cur).ir[TVar4 & 0x7fff].field_1.op12 != 10)))) {
    recff_nyi(J,rd);
    return;
  }
  if (5 < (uVar1 >> 0x18 & 0x1e) - 0xe) {
    if ((uVar1 & 0x1f000000) == 0xa000000) {
      lj_crecord_tonumber(J,rd);
      return;
    }
    uVar3 = 0x7fff;
    if ((uVar1 & 0x1f000000) != 0x4000000) goto LAB_00154cb9;
  }
  uVar3 = uVar1;
  if ((uVar1 & 0x1f000000) == 0x4000000) {
    iVar2 = lj_strscan_num((GCstr *)(ulong)(rd->argv->u32).lo,&TStack_28);
    if (iVar2 == 0) {
      recff_nyi(J,rd);
      return;
    }
    (J->fold).ins.field_0.op1 = (IRRef1)uVar1;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5c8e0000;
    uVar3 = lj_opt_fold(J);
  }
LAB_00154cb9:
  *J->base = uVar3;
  return;
}

Assistant:

static void LJ_FASTCALL recff_tonumber(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  TRef base = J->base[1];
  if (tr && !tref_isnil(base)) {
    base = lj_opt_narrow_toint(J, base);
    if (!tref_isk(base) || IR(tref_ref(base))->i != 10) {
      recff_nyiu(J, rd);
      return;
    }
  }
  if (tref_isnumber_str(tr)) {
    if (tref_isstr(tr)) {
      TValue tmp;
      if (!lj_strscan_num(strV(&rd->argv[0]), &tmp)) {
	recff_nyiu(J, rd);  /* Would need an inverted STRTO for this case. */
	return;
      }
      tr = emitir(IRTG(IR_STRTO, IRT_NUM), tr, 0);
    }
#if LJ_HASFFI
  } else if (tref_iscdata(tr)) {
    lj_crecord_tonumber(J, rd);
    return;
#endif
  } else {
    tr = TREF_NIL;
  }
  J->base[0] = tr;
  UNUSED(rd);
}